

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O2

void __thiscall
GeneratorProfile_relationalAndLogicalOperators_Test::TestBody
          (GeneratorProfile_relationalAndLogicalOperators_Test *this)

{
  char *pcVar1;
  AssertHelper local_80 [15];
  bool falseValue;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_11;
  GeneratorProfilePtr generatorProfile;
  bool trueValue;
  string value;
  
  libcellml::GeneratorProfile::create((Profile)&generatorProfile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value,"value",(allocator<char> *)&gtest_ar_11);
  trueValue = true;
  falseValue = false;
  libcellml::GeneratorProfile::setEqualityString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setEqString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setNeqString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setLtString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setLeqString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setGtString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setGeqString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setAndString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setOrString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setXorString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setNotString
            ((string *)
             generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::GeneratorProfile::setHasEqOperator
            (generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
             _0_1_);
  libcellml::GeneratorProfile::setHasNeqOperator
            (generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
             _0_1_);
  libcellml::GeneratorProfile::setHasLtOperator
            (generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
             _0_1_);
  libcellml::GeneratorProfile::setHasLeqOperator
            (generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
             _0_1_);
  libcellml::GeneratorProfile::setHasGtOperator
            (generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
             _0_1_);
  libcellml::GeneratorProfile::setHasGeqOperator
            (generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
             _0_1_);
  libcellml::GeneratorProfile::setHasAndOperator
            (generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
             _0_1_);
  libcellml::GeneratorProfile::setHasOrOperator
            (generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
             _0_1_);
  libcellml::GeneratorProfile::setHasXorOperator
            (generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
             _0_1_);
  libcellml::GeneratorProfile::setHasNotOperator
            (generatorProfile.
             super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
             _0_1_);
  libcellml::GeneratorProfile::equalityString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->equalityString()",&value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_11);
  std::__cxx11::string::~string((string *)&gtest_ar_11);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_11);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x261,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar_11);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_11);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::eqString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->eqString()",&value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_11);
  std::__cxx11::string::~string((string *)&gtest_ar_11);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_11);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x262,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar_11);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_11);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::neqString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->neqString()",&value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_11);
  std::__cxx11::string::~string((string *)&gtest_ar_11);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_11);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x263,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar_11);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_11);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::ltString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->ltString()",&value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_11);
  std::__cxx11::string::~string((string *)&gtest_ar_11);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_11);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x264,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar_11);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_11);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::leqString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->leqString()",&value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_11);
  std::__cxx11::string::~string((string *)&gtest_ar_11);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_11);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x265,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar_11);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_11);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::gtString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->gtString()",&value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_11);
  std::__cxx11::string::~string((string *)&gtest_ar_11);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_11);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x266,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar_11);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_11);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::geqString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->geqString()",&value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_11);
  std::__cxx11::string::~string((string *)&gtest_ar_11);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_11);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x267,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar_11);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_11);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::andString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->andString()",&value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_11);
  std::__cxx11::string::~string((string *)&gtest_ar_11);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_11);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x268,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar_11);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_11);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::orString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->orString()",&value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_11);
  std::__cxx11::string::~string((string *)&gtest_ar_11);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_11);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x269,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar_11);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_11);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::xorString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->xorString()",&value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_11);
  std::__cxx11::string::~string((string *)&gtest_ar_11);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_11);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x26a,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar_11);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_11);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::GeneratorProfile::notString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"value","generatorProfile->notString()",&value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_11);
  std::__cxx11::string::~string((string *)&gtest_ar_11);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_11);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x26b,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar_11);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_11);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = (bool)libcellml::GeneratorProfile::hasEqOperator();
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_11,"falseValue","generatorProfile->hasEqOperator()",&falseValue,
             &gtest_ar.success_);
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_11.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x26d,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_11.message_);
  gtest_ar.success_ = (bool)libcellml::GeneratorProfile::hasNeqOperator();
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_11,"falseValue","generatorProfile->hasNeqOperator()",&falseValue,
             &gtest_ar.success_);
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_11.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x26e,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_11.message_);
  gtest_ar.success_ = (bool)libcellml::GeneratorProfile::hasLtOperator();
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_11,"falseValue","generatorProfile->hasLtOperator()",&falseValue,
             &gtest_ar.success_);
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_11.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x26f,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_11.message_);
  gtest_ar.success_ = (bool)libcellml::GeneratorProfile::hasLeqOperator();
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_11,"falseValue","generatorProfile->hasLeqOperator()",&falseValue,
             &gtest_ar.success_);
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_11.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x270,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_11.message_);
  gtest_ar.success_ = (bool)libcellml::GeneratorProfile::hasGtOperator();
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_11,"falseValue","generatorProfile->hasGtOperator()",&falseValue,
             &gtest_ar.success_);
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_11.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x271,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_11.message_);
  gtest_ar.success_ = (bool)libcellml::GeneratorProfile::hasGeqOperator();
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_11,"falseValue","generatorProfile->hasGeqOperator()",&falseValue,
             &gtest_ar.success_);
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_11.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x272,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_11.message_);
  gtest_ar.success_ = (bool)libcellml::GeneratorProfile::hasAndOperator();
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_11,"falseValue","generatorProfile->hasAndOperator()",&falseValue,
             &gtest_ar.success_);
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_11.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x273,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_11.message_);
  gtest_ar.success_ = (bool)libcellml::GeneratorProfile::hasOrOperator();
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_11,"falseValue","generatorProfile->hasOrOperator()",&falseValue,
             &gtest_ar.success_);
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_11.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x274,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_11.message_);
  gtest_ar.success_ = (bool)libcellml::GeneratorProfile::hasXorOperator();
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_11,"trueValue","generatorProfile->hasXorOperator()",&trueValue,
             &gtest_ar.success_);
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_11.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x275,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_11.message_);
  gtest_ar.success_ = (bool)libcellml::GeneratorProfile::hasNotOperator();
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar_11,"falseValue","generatorProfile->hasNotOperator()",&falseValue,
             &gtest_ar.success_);
  if (gtest_ar_11.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_11.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/generator/generatorprofile.cpp"
               ,0x276,pcVar1);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_11.message_);
  std::__cxx11::string::~string((string *)&value);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&generatorProfile.
              super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(GeneratorProfile, relationalAndLogicalOperators)
{
    libcellml::GeneratorProfilePtr generatorProfile = libcellml::GeneratorProfile::create();

    const std::string value = "value";
    const bool trueValue = true;
    const bool falseValue = false;

    generatorProfile->setEqualityString(value);
    generatorProfile->setEqString(value);
    generatorProfile->setNeqString(value);
    generatorProfile->setLtString(value);
    generatorProfile->setLeqString(value);
    generatorProfile->setGtString(value);
    generatorProfile->setGeqString(value);
    generatorProfile->setAndString(value);
    generatorProfile->setOrString(value);
    generatorProfile->setXorString(value);
    generatorProfile->setNotString(value);

    generatorProfile->setHasEqOperator(falseValue);
    generatorProfile->setHasNeqOperator(falseValue);
    generatorProfile->setHasLtOperator(falseValue);
    generatorProfile->setHasLeqOperator(falseValue);
    generatorProfile->setHasGtOperator(falseValue);
    generatorProfile->setHasGeqOperator(falseValue);
    generatorProfile->setHasAndOperator(falseValue);
    generatorProfile->setHasOrOperator(falseValue);
    generatorProfile->setHasXorOperator(trueValue);
    generatorProfile->setHasNotOperator(falseValue);

    EXPECT_EQ(value, generatorProfile->equalityString());
    EXPECT_EQ(value, generatorProfile->eqString());
    EXPECT_EQ(value, generatorProfile->neqString());
    EXPECT_EQ(value, generatorProfile->ltString());
    EXPECT_EQ(value, generatorProfile->leqString());
    EXPECT_EQ(value, generatorProfile->gtString());
    EXPECT_EQ(value, generatorProfile->geqString());
    EXPECT_EQ(value, generatorProfile->andString());
    EXPECT_EQ(value, generatorProfile->orString());
    EXPECT_EQ(value, generatorProfile->xorString());
    EXPECT_EQ(value, generatorProfile->notString());

    EXPECT_EQ(falseValue, generatorProfile->hasEqOperator());
    EXPECT_EQ(falseValue, generatorProfile->hasNeqOperator());
    EXPECT_EQ(falseValue, generatorProfile->hasLtOperator());
    EXPECT_EQ(falseValue, generatorProfile->hasLeqOperator());
    EXPECT_EQ(falseValue, generatorProfile->hasGtOperator());
    EXPECT_EQ(falseValue, generatorProfile->hasGeqOperator());
    EXPECT_EQ(falseValue, generatorProfile->hasAndOperator());
    EXPECT_EQ(falseValue, generatorProfile->hasOrOperator());
    EXPECT_EQ(trueValue, generatorProfile->hasXorOperator());
    EXPECT_EQ(falseValue, generatorProfile->hasNotOperator());
}